

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_etc.c
# Opt level: O0

word zzSubAndW(word *b,word *a,size_t n,word w)

{
  ulong uVar1;
  size_t i;
  word prod;
  word borrow;
  word w_local;
  size_t n_local;
  word *a_local;
  word *b_local;
  
  borrow = 0;
  for (i = 0; i < n; i = i + 1) {
    uVar1 = borrow + (w & a[i]);
    borrow = (word)(int)(uint)(b[i] < uVar1 || uVar1 < borrow);
    b[i] = b[i] - uVar1;
  }
  return borrow;
}

Assistant:

word zzSubAndW(word b[], const word a[], size_t n, register word w)
{
	register word borrow = 0;
	register word prod;
	size_t i;
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	for (i = 0; i < n; ++i)
	{
		prod = w & a[i];
		prod += borrow;
		borrow = wordLess01(prod, borrow);
		borrow |= wordLess01(b[i], prod);
		b[i] -= prod;
	}
	prod = w = 0;
	return borrow;
}